

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_try::statement_try
          (statement_try *this,string *name,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *tbody,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *cbody,context_t *c,
          token_base *ptr)

{
  context_t *in_RCX;
  string *in_RSI;
  undefined8 *in_RDI;
  token_base *in_R8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff68;
  statement_base *this_00;
  statement_base local_40 [2];
  
  this_00 = local_40;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_R8,
             (shared_ptr<cs::context_type> *)in_stack_ffffffffffffff68);
  statement_base::statement_base(this_00,in_RCX,in_R8);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x243954);
  *in_RDI = &PTR__statement_try_003be7b8;
  std::__cxx11::string::string((string *)(in_RDI + 4),in_RSI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_R8,
             in_stack_ffffffffffffff68);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_R8,
             in_stack_ffffffffffffff68);
  return;
}

Assistant:

statement_try(std::string name, std::deque<statement_base *> tbody,
		              std::deque<statement_base *> cbody, context_t c, token_base *ptr) : statement_base(
			                  std::move(c), ptr),
			mName(std::move(name)),
			mTryBody(std::move(tbody)),
			mCatchBody(
			    std::move(cbody)) {}